

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fgetline.c
# Opt level: O2

char * fgetline(FILE_conflict *fp)

{
  char *ptr;
  char *pcVar1;
  size_t sVar2;
  size_t oldlen;
  size_t size;
  
  oldlen = 0;
  ptr = (char *)safemalloc(0x200,1,0);
  size = 0x200;
  while( true ) {
    pcVar1 = fgets(ptr + oldlen,(int)size - (int)oldlen,(FILE *)fp);
    if (pcVar1 == (char *)0x0) break;
    sVar2 = strlen(ptr + oldlen);
    oldlen = oldlen + sVar2;
    if ((oldlen != 0) && (ptr[oldlen - 1] == '\n')) goto LAB_0011bc4f;
    ptr = (char *)safegrowarray(ptr,&size,1,oldlen,0x200,true);
  }
  if (oldlen == 0) {
    safefree(ptr);
    ptr = (char *)0x0;
  }
  else {
LAB_0011bc4f:
    ptr[oldlen] = '\0';
  }
  return ptr;
}

Assistant:

char *fgetline(FILE *fp)
{
    char *ret = snewn(512, char);
    size_t size = 512, len = 0;
    while (fgets(ret + len, size - len, fp)) {
        len += strlen(ret + len);
        if (len > 0 && ret[len-1] == '\n')
            break;                     /* got a newline, we're done */
        sgrowarrayn_nm(ret, size, len, 512);
    }
    if (len == 0) {                    /* first fgets returned NULL */
        sfree(ret);
        return NULL;
    }
    ret[len] = '\0';
    return ret;
}